

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O2

bool __thiscall dg::vr::Bucket::EdgeIterator::nextViableTopEdge(EdgeIterator *this)

{
  SetIterator *pSVar1;
  _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
  *this_00;
  bool bVar2;
  bool bVar3;
  RelationEdge local_30;
  
  while( true ) {
    bVar2 = DirectRelIterator::nextViableEdge
                      ((this->stack).
                       super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
    if (!bVar2) {
      return bVar2;
    }
    bVar3 = isViable(this);
    if (bVar3) break;
    pSVar1 = &(this->stack).
              super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].bucketIt;
    pSVar1->_M_current = pSVar1->_M_current + 1;
  }
  std::
  _Rb_tree<dg::vr::Bucket::RelationEdge,dg::vr::Bucket::RelationEdge,std::_Identity<dg::vr::Bucket::RelationEdge>,std::less<dg::vr::Bucket::RelationEdge>,std::allocator<dg::vr::Bucket::RelationEdge>>
  ::_M_emplace_unique<dg::vr::Bucket::RelationEdge_const&>
            ((_Rb_tree<dg::vr::Bucket::RelationEdge,dg::vr::Bucket::RelationEdge,std::_Identity<dg::vr::Bucket::RelationEdge>,std::less<dg::vr::Bucket::RelationEdge>,std::allocator<dg::vr::Bucket::RelationEdge>>
              *)(this->visited)._M_data,
             &(this->stack).
              super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].current);
  if (this->undirectedOnly != true) {
    return bVar2;
  }
  this_00 = &((this->visited)._M_data)->_M_t;
  RelationEdge::inverted
            (&local_30,
             &(this->stack).
              super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].current);
  std::
  _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
  ::_M_emplace_unique<dg::vr::Bucket::RelationEdge>(this_00,&local_30);
  return bVar2;
}

Assistant:

bool nextViableTopEdge() {
            while (stack.back().nextViableEdge()) {
                if (isViable()) {
                    visited.get().emplace(*stack.back());
                    if (undirectedOnly)
                        visited.get().emplace(stack.back()->inverted());
                    return true;
                }
                stack.back().inc();
            }
            return false;
        }